

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<vkb::SystemInfo> *
vkb::SystemInfo::get_system_info
          (Result<vkb::SystemInfo> *__return_storage_ptr__,
          PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr)

{
  bool bVar1;
  SystemInfo local_48;
  
  bVar1 = detail::VulkanFunctions::init_vulkan_funcs
                    ((VulkanFunctions *)detail::vulkan_functions()::v,fp_vkGetInstanceProcAddr);
  if (bVar1) {
    SystemInfo(&local_48);
    (__return_storage_ptr__->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x30) = local_48._48_8_;
    __return_storage_ptr__->m_init = true;
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::instance_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  return __return_storage_ptr__;
}

Assistant:

Result<SystemInfo> SystemInfo::get_system_info(PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr) {
    // Using externally provided function pointers, assume the loader is available
    if (!detail::vulkan_functions().init_vulkan_funcs(fp_vkGetInstanceProcAddr)) {
        return make_error_code(InstanceError::vulkan_unavailable);
    }
    return SystemInfo();
}